

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.cpp
# Opt level: O2

void ssllabs::Endpoint::parseSuitesList(ConstObject *obj,labsSuite_t *labsSuite)

{
  bool bVar1;
  int iVar2;
  ValueType *pVVar3;
  
  bVar1 = rapidjson::
          GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
          ::HasMember(obj,"id");
  if (bVar1) {
    pVVar3 = rapidjson::
             GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
             ::operator[]<char_const>
                       ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                         *)obj,"id");
    if ((undefined1  [16])((undefined1  [16])pVVar3->data_ & (undefined1  [16])0x20000000000000) !=
        (undefined1  [16])0x0) {
      pVVar3 = rapidjson::
               GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
               ::operator[]<char_const>
                         ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                           *)obj,"id");
      iVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetInt(pVVar3);
      labsSuite->Id = iVar2;
    }
  }
  bVar1 = rapidjson::
          GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
          ::HasMember(obj,"name");
  if (bVar1) {
    pVVar3 = rapidjson::
             GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
             ::operator[]<char_const>
                       ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                         *)obj,"name");
    if ((undefined1  [16])((undefined1  [16])pVVar3->data_ & (undefined1  [16])0x400000000000000) !=
        (undefined1  [16])0x0) {
      pVVar3 = rapidjson::
               GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
               ::operator[]<char_const>
                         ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                           *)obj,"name");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GetString(pVVar3);
      std::__cxx11::string::assign((char *)&labsSuite->Name);
    }
  }
  bVar1 = rapidjson::
          GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
          ::HasMember(obj,"cipherStrength");
  if (bVar1) {
    pVVar3 = rapidjson::
             GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
             ::operator[]<char_const>
                       ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                         *)obj,"cipherStrength");
    if ((undefined1  [16])((undefined1  [16])pVVar3->data_ & (undefined1  [16])0x20000000000000) !=
        (undefined1  [16])0x0) {
      pVVar3 = rapidjson::
               GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
               ::operator[]<char_const>
                         ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                           *)obj,"cipherStrength");
      iVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetInt(pVVar3);
      labsSuite->CipherStrength = iVar2;
    }
  }
  bVar1 = rapidjson::
          GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
          ::HasMember(obj,"dhStrength");
  if (bVar1) {
    pVVar3 = rapidjson::
             GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
             ::operator[]<char_const>
                       ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                         *)obj,"dhStrength");
    if ((undefined1  [16])((undefined1  [16])pVVar3->data_ & (undefined1  [16])0x20000000000000) !=
        (undefined1  [16])0x0) {
      pVVar3 = rapidjson::
               GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
               ::operator[]<char_const>
                         ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                           *)obj,"dhStrength");
      iVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetInt(pVVar3);
      labsSuite->DhStrength = iVar2;
    }
  }
  bVar1 = rapidjson::
          GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
          ::HasMember(obj,"dhP");
  if (bVar1) {
    pVVar3 = rapidjson::
             GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
             ::operator[]<char_const>
                       ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                         *)obj,"dhP");
    if ((undefined1  [16])((undefined1  [16])pVVar3->data_ & (undefined1  [16])0x20000000000000) !=
        (undefined1  [16])0x0) {
      pVVar3 = rapidjson::
               GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
               ::operator[]<char_const>
                         ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                           *)obj,"dhP");
      iVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetInt(pVVar3);
      labsSuite->DhP = iVar2;
    }
  }
  bVar1 = rapidjson::
          GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
          ::HasMember(obj,"dhG");
  if (bVar1) {
    pVVar3 = rapidjson::
             GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
             ::operator[]<char_const>
                       ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                         *)obj,"dhG");
    if ((undefined1  [16])((undefined1  [16])pVVar3->data_ & (undefined1  [16])0x20000000000000) !=
        (undefined1  [16])0x0) {
      pVVar3 = rapidjson::
               GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
               ::operator[]<char_const>
                         ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                           *)obj,"dhG");
      iVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetInt(pVVar3);
      labsSuite->DhG = iVar2;
    }
  }
  bVar1 = rapidjson::
          GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
          ::HasMember(obj,"dhYs");
  if (bVar1) {
    pVVar3 = rapidjson::
             GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
             ::operator[]<char_const>
                       ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                         *)obj,"dhYs");
    if ((undefined1  [16])((undefined1  [16])pVVar3->data_ & (undefined1  [16])0x20000000000000) !=
        (undefined1  [16])0x0) {
      pVVar3 = rapidjson::
               GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
               ::operator[]<char_const>
                         ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                           *)obj,"dhYs");
      iVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetInt(pVVar3);
      labsSuite->DhYs = iVar2;
    }
  }
  return;
}

Assistant:

void Endpoint::parseSuitesList(const rapidjson::GenericValue<rapidjson::UTF8<char>,
            rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::ConstObject &obj, labsSuite_t &labsSuite) {

        if (obj.HasMember("id") && obj["id"].IsInt()) {
            labsSuite.Id = obj["id"].GetInt();
        }

        if (obj.HasMember("name") && obj["name"].IsString()) {
            labsSuite.Name.assign(obj["name"].GetString());
        }

        if (obj.HasMember("cipherStrength") && obj["cipherStrength"].IsInt()) {
            labsSuite.CipherStrength = obj["cipherStrength"].GetInt();
        }

        if (obj.HasMember("dhStrength") && obj["dhStrength"].IsInt()) {
            labsSuite.DhStrength = obj["dhStrength"].GetInt();
        }

        if (obj.HasMember("dhP") && obj["dhP"].IsInt()) {
            labsSuite.DhP = obj["dhP"].GetInt();
        }

        if (obj.HasMember("dhG") && obj["dhG"].IsInt()) {
            labsSuite.DhG = obj["dhG"].GetInt();
        }

        if (obj.HasMember("dhYs") && obj["dhYs"].IsInt()) {
            labsSuite.DhYs = obj["dhYs"].GetInt();
        }
    }